

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O0

bool ImGui::SelectableTooltip
               (char *label,bool *p_selected,bool bEnabled,char *tip,ImGuiSelectableFlags flags,
               ImVec2 *size)

{
  byte bVar1;
  bool bVar2;
  long in_RCX;
  byte in_DL;
  uint in_R8D;
  bool *in_R9;
  bool bRet;
  ImGuiSelectableFlags in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  
  if ((in_DL & 1) == 0) {
    in_R8D = in_R8D | 8;
  }
  bVar1 = Selectable((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_R9,
                     in_stack_ffffffffffffffcc,(ImVec2 *)0x1faaef);
  if ((in_RCX != 0) && (bVar2 = IsItemHovered((ImGuiHoveredFlags)in_R9), bVar2)) {
    SetTooltip("%s",in_RCX);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

IMGUI_API bool SelectableTooltip(const char* label,
                                 bool* p_selected,
                                 bool bEnabled,
                                 const char* tip,
                                 ImGuiSelectableFlags flags,
                                 const ImVec2& size)
{
    // Turn background green when selected
    // do the selectable and remember the return value
    if (!bEnabled)
        flags |= ImGuiSelectableFlags_Disabled;
    const bool bRet = ImGui::Selectable(label, p_selected,flags, size);
    // if given do a tooltip
    if (tip && IsItemHovered())
        SetTooltip("%s", tip);
    // return if it was just clicked
    return bRet;
}